

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O2

DdNode * Cudd_bddOr(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddAndRecur(dd,(DdNode *)((ulong)f ^ 1),(DdNode *)((ulong)g ^ 1));
  } while (dd->reordered == 1);
  return (DdNode *)((ulong)(pDVar1 != (DdNode *)0x0) ^ (ulong)pDVar1);
}

Assistant:

DdNode *
Cudd_bddOr(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddBddAndRecur(dd,Cudd_Not(f),Cudd_Not(g));
    } while (dd->reordered == 1);
    res = Cudd_NotCond(res,res != NULL);
    return(res);

}